

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

date_time * __thiscall booster::locale::date_time::operator=(date_time *this,date_time *other)

{
  date_time *in_RSI;
  date_time *in_RDI;
  date_time *unaff_retaddr;
  date_time tmp;
  date_time *other_00;
  date_time local_18 [2];
  
  if (in_RDI != in_RSI) {
    other_00 = local_18;
    date_time(unaff_retaddr,in_RDI);
    swap(in_RDI,other_00);
    ~date_time((date_time *)0x23028c);
  }
  return in_RDI;
}

Assistant:

date_time const &date_time::operator = (date_time const &other)
{
    if(this != &other) {
        date_time tmp(other);
        swap(tmp);
    }
    return *this;
}